

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void init_ts_info(TCGContext_conflict9 *tcg_ctx,tcg_temp_info *infos,TCGTempSet *temps_used,
                 TCGTemp *ts)

{
  int iVar1;
  size_t nr;
  tcg_temp_info *ptVar2;
  tcg_temp_info *ti;
  size_t idx;
  TCGTemp *ts_local;
  TCGTempSet *temps_used_local;
  tcg_temp_info *infos_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  nr = temp_idx(tcg_ctx,ts);
  iVar1 = test_bit(nr,temps_used->l);
  if (iVar1 == 0) {
    ptVar2 = infos + nr;
    ts->state_ptr = ptVar2;
    ptVar2->next_copy = ts;
    ptVar2->prev_copy = ts;
    ptVar2->is_const = false;
    ptVar2->mask = 0xffffffffffffffff;
    set_bit(nr,temps_used->l);
  }
  return;
}

Assistant:

static void init_ts_info(TCGContext *tcg_ctx, struct tcg_temp_info *infos,
                         TCGTempSet *temps_used, TCGTemp *ts)
{
    size_t idx = temp_idx(tcg_ctx, ts);
    if (!test_bit(idx, temps_used->l)) {
        struct tcg_temp_info *ti = &infos[idx];

        ts->state_ptr = ti;
        ti->next_copy = ts;
        ti->prev_copy = ts;
        ti->is_const = false;
        ti->mask = -1;
        set_bit(idx, temps_used->l);
    }
}